

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O1

void per_scan_setup(j_compress_ptr cinfo)

{
  uint uVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  jpeg_error_mgr *pjVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  iVar9 = cinfo->comps_in_scan;
  if (iVar9 == 1) {
    pjVar3 = cinfo->cur_comp_info[0];
    cinfo->MCUs_per_row = pjVar3->width_in_blocks;
    uVar7 = pjVar3->height_in_blocks;
    cinfo->MCU_rows_in_scan = uVar7;
    pjVar3->MCU_width = 1;
    pjVar3->MCU_height = 1;
    pjVar3->MCU_blocks = 1;
    pjVar3->MCU_sample_width = 8;
    pjVar3->last_col_width = 1;
    uVar7 = uVar7 % (uint)pjVar3->v_samp_factor;
    if (uVar7 == 0) {
      uVar7 = pjVar3->v_samp_factor;
    }
    pjVar3->last_row_height = uVar7;
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;
  }
  else {
    if (iVar9 - 5U < 0xfffffffc) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x1a;
      (pjVar4->msg_parm).i[0] = iVar9;
      (cinfo->err->msg_parm).i[1] = 4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    lVar5 = jdiv_round_up((ulong)cinfo->image_width,(long)cinfo->max_h_samp_factor << 3);
    cinfo->MCUs_per_row = (JDIMENSION)lVar5;
    lVar5 = jdiv_round_up((ulong)cinfo->image_height,(long)cinfo->max_v_samp_factor << 3);
    cinfo->MCU_rows_in_scan = (JDIMENSION)lVar5;
    cinfo->blocks_in_MCU = 0;
    if (0 < cinfo->comps_in_scan) {
      lVar5 = 0;
      do {
        pjVar3 = cinfo->cur_comp_info[lVar5];
        uVar7 = pjVar3->h_samp_factor;
        uVar1 = pjVar3->v_samp_factor;
        pjVar3->MCU_width = uVar7;
        pjVar3->MCU_height = uVar1;
        iVar9 = uVar1 * uVar7;
        pjVar3->MCU_blocks = iVar9;
        pjVar3->MCU_sample_width = uVar7 * 8;
        uVar8 = pjVar3->width_in_blocks % uVar7;
        if (uVar8 == 0) {
          uVar8 = uVar7;
        }
        pjVar3->last_col_width = uVar8;
        uVar7 = (uint)((ulong)pjVar3->height_in_blocks % (ulong)uVar1);
        if (uVar7 == 0) {
          uVar7 = uVar1;
        }
        pjVar3->last_row_height = uVar7;
        if (10 < cinfo->blocks_in_MCU + iVar9) {
          pjVar4 = cinfo->err;
          pjVar4->msg_code = 0xd;
          (*pjVar4->error_exit)((j_common_ptr)cinfo);
        }
        if (0 < iVar9) {
          iVar9 = iVar9 + 1;
          do {
            iVar2 = cinfo->blocks_in_MCU;
            cinfo->blocks_in_MCU = iVar2 + 1;
            cinfo->MCU_membership[iVar2] = (int)lVar5;
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < cinfo->comps_in_scan);
    }
  }
  if (0 < (long)cinfo->restart_in_rows) {
    uVar6 = (ulong)cinfo->MCUs_per_row * (long)cinfo->restart_in_rows;
    if (0xfffe < uVar6) {
      uVar6 = 0xffff;
    }
    cinfo->restart_interval = (uint)uVar6;
  }
  return;
}

Assistant:

LOCAL(void)
per_scan_setup(j_compress_ptr cinfo)
/* Do computations that are needed before processing a JPEG scan */
/* cinfo->comps_in_scan and cinfo->cur_comp_info[] are already set */
{
  int ci, mcublks, tmp;
  jpeg_component_info *compptr;

  if (cinfo->comps_in_scan == 1) {

    /* Noninterleaved (single-component) scan */
    compptr = cinfo->cur_comp_info[0];

    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = compptr->width_in_blocks;
    cinfo->MCU_rows_in_scan = compptr->height_in_blocks;

    /* For noninterleaved scan, always one block per MCU */
    compptr->MCU_width = 1;
    compptr->MCU_height = 1;
    compptr->MCU_blocks = 1;
    compptr->MCU_sample_width = DCTSIZE;
    compptr->last_col_width = 1;
    /* For noninterleaved scans, it is convenient to define last_row_height
     * as the number of block rows present in the last iMCU row.
     */
    tmp = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
    if (tmp == 0) tmp = compptr->v_samp_factor;
    compptr->last_row_height = tmp;

    /* Prepare array describing MCU composition */
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;

  } else {

    /* Interleaved (multi-component) scan */
    if (cinfo->comps_in_scan <= 0 || cinfo->comps_in_scan > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->comps_in_scan,
               MAX_COMPS_IN_SCAN);

    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = (JDIMENSION)
      jdiv_round_up((long)cinfo->_jpeg_width,
                    (long)(cinfo->max_h_samp_factor * DCTSIZE));
    cinfo->MCU_rows_in_scan = (JDIMENSION)
      jdiv_round_up((long)cinfo->_jpeg_height,
                    (long)(cinfo->max_v_samp_factor * DCTSIZE));

    cinfo->blocks_in_MCU = 0;

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Sampling factors give # of blocks of component in each MCU */
      compptr->MCU_width = compptr->h_samp_factor;
      compptr->MCU_height = compptr->v_samp_factor;
      compptr->MCU_blocks = compptr->MCU_width * compptr->MCU_height;
      compptr->MCU_sample_width = compptr->MCU_width * DCTSIZE;
      /* Figure number of non-dummy blocks in last MCU column & row */
      tmp = (int)(compptr->width_in_blocks % compptr->MCU_width);
      if (tmp == 0) tmp = compptr->MCU_width;
      compptr->last_col_width = tmp;
      tmp = (int)(compptr->height_in_blocks % compptr->MCU_height);
      if (tmp == 0) tmp = compptr->MCU_height;
      compptr->last_row_height = tmp;
      /* Prepare array describing MCU composition */
      mcublks = compptr->MCU_blocks;
      if (cinfo->blocks_in_MCU + mcublks > C_MAX_BLOCKS_IN_MCU)
        ERREXIT(cinfo, JERR_BAD_MCU_SIZE);
      while (mcublks-- > 0) {
        cinfo->MCU_membership[cinfo->blocks_in_MCU++] = ci;
      }
    }

  }

  /* Convert restart specified in rows to actual MCU count. */
  /* Note that count must fit in 16 bits, so we provide limiting. */
  if (cinfo->restart_in_rows > 0) {
    long nominal = (long)cinfo->restart_in_rows * (long)cinfo->MCUs_per_row;
    cinfo->restart_interval = (unsigned int)MIN(nominal, 65535L);
  }
}